

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbenchmarkvalgrind.cpp
# Opt level: O3

qint64 QBenchmarkValgrindUtils::extractResult(QString *fileName)

{
  undefined1 *puVar1;
  qsizetype qVar2;
  char cVar3;
  undefined8 extraout_RAX;
  storage_type *psVar4;
  storage_type *psVar5;
  long in_FS_OFFSET;
  __integer_from_chars_result_type<long_long> _Var6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  qint64 v;
  undefined1 *local_88 [4];
  QArrayData *local_68;
  storage_type *psStack_60;
  qsizetype local_58;
  QByteArray local_48;
  
  local_48.d.size = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_48.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QFile::QFile((QFile *)&local_48,fileName);
  QFile::open((QFile *)&local_48,0x11);
  local_68 = (QArrayData *)0x0;
  psStack_60 = (storage_type *)0x0;
  local_58 = 0;
  do {
    do {
      cVar3 = QIODevice::readLineInto(&local_48,(longlong)&local_68);
      qVar2 = local_58;
      psVar5 = psStack_60;
      if (cVar3 == '\0') {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
          extractResult((QBenchmarkValgrindUtils *)local_88);
          QFile::~QFile((QFile *)&local_48);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
            _Unwind_Resume(extraout_RAX);
          }
        }
        goto LAB_00151b6d;
      }
      QVar7.m_data = psStack_60;
      QVar7.m_size = local_58;
      QVar8.m_data = "summary: ";
      QVar8.m_size = 9;
      cVar3 = QtPrivate::startsWith(QVar7,QVar8);
    } while (cVar3 == '\0');
    if ((local_68 == (QArrayData *)0x0) ||
       (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_68,(AllocationOption)qVar2);
      psVar5 = psStack_60;
      if (local_68 != (QArrayData *)0x0) goto LAB_00151a47;
LAB_00151a51:
      QByteArray::reallocData((longlong)&local_68,(AllocationOption)local_58);
      psVar4 = psStack_60;
    }
    else {
LAB_00151a47:
      psVar4 = psVar5;
      if (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i) goto LAB_00151a51;
    }
    local_88[0] = &DAT_aaaaaaaaaaaaaaaa;
    _Var6 = std::from_chars<long_long>(psVar5 + 9,psVar4 + local_58,(longlong *)local_88,10);
    puVar1 = local_88[0];
  } while (_Var6.ec != 0);
  if (local_68 != (QArrayData *)0x0) {
    LOCK();
    (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_68,1,0x10);
    }
  }
  QFile::~QFile((QFile *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_48.d.size) {
    return (qint64)puVar1;
  }
LAB_00151b6d:
  __stack_chk_fail();
}

Assistant:

qint64 QBenchmarkValgrindUtils::extractResult(const QString &fileName)
{
    QFile file(fileName);
    const bool openOk = file.open(QIODevice::ReadOnly | QIODevice::Text);
    Q_ASSERT(openOk);
    Q_UNUSED(openOk);

    std::optional<qint64> val = std::nullopt;
    QByteArray line;
    while (file.readLineInto(&line)) {
        constexpr QByteArrayView tag = "summary: ";
        if (line.startsWith(tag)) {
            const auto maybeNumber = line.data() + tag.size();
            const auto end = line.data() + line.size();
            qint64 v;
            const auto r = std::from_chars(maybeNumber, end, v);
            if (r.ec == std::errc{}) {
                val = v;
                break;
            }
        }
    }
    if (Q_UNLIKELY(!val))
        qFatal("Failed to extract result");
    return *val;
}